

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::flipClosed(Roaring64Map *this,uint32_t min,uint32_t max)

{
  iterator iter_00;
  bool bVar1;
  pointer ppVar2;
  tuple<> *in_RDI;
  Roaring *bitmap;
  Roaring *bitmap_1;
  iterator iter;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  piecewise_construct_t *in_stack_ffffffffffffffa8;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_30;
  _Base_ptr local_28;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::begin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)in_RDI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::end((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)in_RDI);
  bVar1 = std::operator==(local_18,&local_20);
  uVar3 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                        0x126588);
    uVar3 = ppVar2->first != 0;
  }
  if ((bool)uVar3 != false) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
    _Rb_tree_const_iterator(&local_30,local_18);
    in_stack_ffffffffffffffc4 = 0;
    std::forward_as_tuple<int>((int *)in_RDI);
    std::forward_as_tuple<>();
    local_28 = (_Base_ptr)
               std::
               map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
               ::emplace_hint<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffa8,
                          (tuple<int_&&> *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),in_RDI);
    local_18[0]._M_node = local_28;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                        0x126602);
    in_stack_ffffffffffffffb8._M_node = (_Base_ptr)&ppVar2->second;
    Roaring::setCopyOnWrite
              ((Roaring *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),SUB81((ulong)in_RDI >> 0x38,0));
  }
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x12662e);
  Roaring::flipClosed((Roaring *)CONCAT17(uVar3,in_stack_ffffffffffffffa0),
                      (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  iter_00._M_node._4_4_ = in_stack_ffffffffffffffc4;
  iter_00._M_node._0_4_ = in_stack_ffffffffffffffc0;
  eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffffb8._M_node,iter_00);
  return;
}

Assistant:

void flipClosed(uint32_t min, uint32_t max) {
        auto iter = roarings.begin();
        // Since min and max are uint32_t, highbytes(min or max) == 0. The inner
        // bitmap we are looking for, if it exists, will be at the first slot of
        // 'roarings'. If it does not exist, we have to create it.
        if (iter == roarings.end() || iter->first != 0) {
            iter = roarings.emplace_hint(iter, std::piecewise_construct,
                                         std::forward_as_tuple(0),
                                         std::forward_as_tuple());
            auto &bitmap = iter->second;
            bitmap.setCopyOnWrite(copyOnWrite);
        }
        auto &bitmap = iter->second;
        bitmap.flipClosed(min, max);
        eraseIfEmpty(iter);
    }